

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall KktChStep::printAR(KktChStep *this)

{
  bool bVar1;
  _Setw _Var2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  int *in_RDI;
  int ind;
  int j;
  int i_1;
  int i;
  char buff [4];
  int local_20;
  int local_1c;
  int local_18;
  int local_10;
  char local_c [12];
  
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  for (local_10 = 0; local_10 < in_RDI[0x3e]; local_10 = local_10 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x52),(long)local_10);
    sprintf(local_c,"%2.1g ",*pvVar3);
    _Var2 = std::setw(5);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar4,local_c);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------AR-|-b-----\n");
  local_18 = 0;
  do {
    if (in_RDI[1] <= local_18) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      return;
    }
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_18);
      local_20 = *pvVar5;
      while( true ) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_20);
        bVar1 = false;
        if (*pvVar5 != local_1c) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_18 + 1)
                             );
          bVar1 = local_20 < *pvVar5;
        }
        if (!bVar1) break;
        local_20 = local_20 + 1;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_20);
      if (*pvVar5 == local_1c) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_18 + 1));
        if (*pvVar5 <= local_20) goto LAB_001c44c3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_20
                           );
        sprintf(local_c,"%2.1g ",*pvVar3);
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,local_c);
      }
      else {
LAB_001c44c3:
        _Var2 = std::setw(5);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
        std::operator<<(poVar4,"   ");
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"  |   ");
    _Var2 = std::setw(5);
    poVar4 = std::operator<<(poVar4,_Var2);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),(long)local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    poVar4 = std::operator<<(poVar4," < < ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),(long)local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void KktChStep::printAR() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<RnumRow;i++) {
		for (int j=0;j<RnumCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1]) 
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
		
	}
	
	cout<<endl;
}